

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhash.c
# Opt level: O3

tommy_uint32_t tommy_strhash_u32(tommy_uint64_t init_val,void *void_key)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  
  uVar6 = (int)init_val + 0xdeadbeef;
  uVar4 = *void_key;
  uVar2 = uVar6;
  uVar7 = uVar6;
  if ((~(0x1010100 - uVar4 | uVar4) & 0x80808080) == 0) {
    puVar5 = (uint *)((long)void_key + 0xc);
    do {
      uVar2 = uVar4 + uVar2;
      uVar4 = puVar5[-2];
      if ((~(0x1010100 - uVar4 | uVar4) & 0x80808080) != 0) {
        if (((uVar4 & 0xff) != 0) && (uVar7 = uVar7 + (uVar4 & 0xff), (uVar4 & 0xff00) != 0)) {
          uVar7 = uVar7 + (uVar4 & 0xffff00);
        }
        goto LAB_0010de13;
      }
      uVar7 = uVar4 + uVar7;
      uVar4 = puVar5[-1];
      if ((~(0x1010100 - uVar4 | uVar4) & 0x80808080) != 0) {
        if (((uVar4 & 0xff) != 0) && (uVar6 = uVar6 + (uVar4 & 0xff), (uVar4 & 0xff00) != 0)) {
          uVar6 = uVar6 + (uVar4 & 0xffff00);
        }
        goto LAB_0010de13;
      }
      uVar4 = uVar4 + uVar6;
      uVar2 = (uVar4 * 0x10 | uVar4 >> 0x1c) ^ uVar2 - uVar4;
      uVar6 = (uVar2 << 6 | uVar2 >> 0x1a) ^ uVar7 - uVar2;
      iVar1 = uVar2 + uVar4 + uVar7;
      uVar4 = (uVar6 << 8 | uVar6 >> 0x18) ^ (uVar4 + uVar7) - uVar6;
      iVar3 = uVar6 + iVar1;
      uVar2 = (uVar4 << 0x10 | uVar4 >> 0x10) ^ iVar1 - uVar4;
      iVar1 = uVar4 + iVar3;
      uVar7 = (uVar2 << 0x13 | uVar2 >> 0xd) ^ iVar3 - uVar2;
      uVar2 = uVar2 + iVar1;
      uVar6 = (uVar7 << 4 | uVar7 >> 0x1c) ^ iVar1 - uVar7;
      uVar7 = uVar7 + uVar2;
      uVar4 = *puVar5;
      puVar5 = puVar5 + 3;
    } while ((~(0x1010100 - uVar4 | uVar4) & 0x80808080) == 0);
  }
  if (((uVar4 & 0xff) != 0) && (uVar2 = (uVar4 & 0xff) + uVar2, (uVar4 & 0xff00) != 0)) {
    uVar2 = (uVar4 & 0xffff00) + uVar2;
  }
LAB_0010de13:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  uVar4 = (uVar6 ^ uVar7) - (uVar7 << 0xe | uVar7 >> 0x12);
  uVar2 = (uVar2 ^ uVar4) - (uVar4 * 0x800 | uVar4 >> 0x15);
  uVar7 = (uVar7 ^ uVar2) - (uVar2 * 0x2000000 | uVar2 >> 7);
  uVar4 = (uVar4 ^ uVar7) - (uVar7 * 0x10000 | uVar7 >> 0x10);
  uVar2 = (uVar2 ^ uVar4) - (uVar4 * 0x10 | uVar4 >> 0x1c);
  uVar2 = (uVar7 ^ uVar2) - (uVar2 * 0x4000 | uVar2 >> 0x12);
  return (uVar4 ^ uVar2) - (uVar2 * 0x1000000 | uVar2 >> 8);
}

Assistant:

tommy_uint32_t tommy_strhash_u32(tommy_uint64_t init_val, const void* void_key)
{
	const unsigned char* key = tommy_cast(const unsigned char*, void_key);
	tommy_uint32_t a, b, c;
	tommy_uint32_t m[3] = { 0xff, 0xff00, 0xff0000 };

	a = b = c = 0xdeadbeef + init_val;
	/* this is different than original lookup3 and the result won't match */

	while (1) {
		tommy_uint32_t v = tommy_le_uint32_read(key);

		if (tommy_haszero_u32(v)) {
			if (v & m[0]) {
				a += v & m[0];
				if (v & m[1]) {
					a += v & m[1];
					if (v & m[2])
						a += v & m[2];
				}
			}

			break;
		}

		a += v;

		v = tommy_le_uint32_read(key + 4);

		if (tommy_haszero_u32(v)) {
			if (v & m[0]) {
				b += v & m[0];
				if (v & m[1]) {
					b += v & m[1];
					if (v & m[2])
						b += v & m[2];
				}
			}

			break;
		}

		b += v;

		v = tommy_le_uint32_read(key + 8);

		if (tommy_haszero_u32(v)) {
			if (v & m[0]) {
				c += v & m[0];
				if (v & m[1]) {
					c += v & m[1];
					if (v & m[2])
						c += v & m[2];
				}
			}

			break;
		}

		c += v;

		tommy_mix(a, b, c);

		key += 12;
	}

	/* for lengths that are multiplers of 12 we already have called mix */
	/* this is different than the original lookup3 and the result won't match */

	tommy_final(a, b, c);

	return c;
}